

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_4ae02a::AddInstallRuntimeDependenciesGenerator
               (Helper *helper,cmInstallRuntimeDependencySet *runtimeDependencySet,
               cmInstallCommandArguments *runtimeArgs,cmInstallCommandArguments *libraryArgs,
               cmInstallCommandArguments *frameworkArgs,
               RuntimeDependenciesArgs *runtimeDependenciesArgs,bool *installsRuntime,
               bool *installsLibrary,bool *installsFramework)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *__args_13;
  cmInstallCommandArguments *pcVar8;
  undefined1 local_123 [3];
  Helper *local_120;
  MessageLevel local_114;
  undefined8 local_110;
  cmInstallCommandArguments *local_108;
  undefined1 local_100 [8];
  string local_f8;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_d8;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_d0;
  undefined1 local_c8 [40];
  cmInstallRuntimeDependencySet *runtimeDependencySet_local;
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  
  pcVar1 = helper->Makefile;
  local_120 = helper;
  local_108 = frameworkArgs;
  runtimeDependencySet_local = runtimeDependencySet;
  local_78._24_8_ = libraryArgs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_100 + 8),"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)local_98);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)(local_100 + 8));
  local_c8._32_8_ = psVar4->_M_string_length;
  std::__cxx11::string::~string((string *)(local_100 + 8));
  pcVar1 = local_120->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_100 + 8),"CMAKE_HOST_SYSTEM_NAME",(allocator<char> *)local_98);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)(local_100 + 8));
  bVar2 = std::operator==(psVar4,"Darwin");
  std::__cxx11::string::~string((string *)(local_100 + 8));
  pcVar8 = runtimeArgs;
  if ((_Elt_pointer)local_c8._32_8_ == (_Elt_pointer)0x0) {
    pcVar8 = (cmInstallCommandArguments *)local_78._24_8_;
  }
  local_78._32_8_ = runtimeArgs;
  pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&configurations,pvVar5);
  if (bVar2) {
    pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(local_108);
    pbVar7 = (pvVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(local_108);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (pbVar7,(pvVar5->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish,&configurations);
  }
  psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_(pcVar8);
  if (bVar2) {
    psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_(local_108);
    std::__cxx11::string::string((string *)(local_100 + 8),(string *)psVar6);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_100 + 8),"",(allocator<char> *)((long)&local_110 + 7));
  }
  local_c8[0] = 1;
  local_78._0_4_ = cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
  bVar3 = cmInstallCommandArguments::GetExcludeFromAll(pcVar8);
  local_78._40_8_ = psVar4;
  if (bVar2 && bVar3) {
    bVar3 = cmInstallCommandArguments::GetExcludeFromAll(local_108);
  }
  local_100[0] = bVar3;
  cmMakefile::GetBacktrace((cmMakefile *)local_98);
  std::
  make_unique<cmInstallGetRuntimeDependenciesGenerator,cmInstallRuntimeDependencySet*&,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string_const&,std::__cxx11::string_const,bool,char_const(&)[12],char_const(&)[13],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((cmInstallRuntimeDependencySet **)(local_c8 + 0x18),
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&runtimeDependencySet_local,&runtimeDependenciesArgs->Directories,
             &runtimeDependenciesArgs->PreIncludeRegexes,&runtimeDependenciesArgs->PreExcludeRegexes
             ,&runtimeDependenciesArgs->PostIncludeRegexes,
             &runtimeDependenciesArgs->PostExcludeRegexes,&runtimeDependenciesArgs->PostIncludeFiles
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &runtimeDependenciesArgs->PostExcludeFiles,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._40_8_,
             (bool *)(local_100 + 8),(char (*) [12])local_c8,(char (*) [13])"_CMAKE_DEPS",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"_CMAKE_RPATH",(MessageLevel *)&configurations,(bool *)local_78,
             (cmListFileBacktrace *)local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::__cxx11::string::~string((string *)(local_100 + 8));
  local_c8._16_8_ = local_c8._24_8_;
  local_c8._24_8_ = (_Elt_pointer)0x0;
  cmMakefile::AddInstallGenerator
            (local_120->Makefile,
             (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
             (local_c8 + 0x10));
  if ((_Elt_pointer)local_c8._16_8_ != (_Elt_pointer)0x0) {
    (*(code *)((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8._16_8_)->_M_impl).super__Vector_impl_data._M_start)->_M_string_length)
              ();
  }
  local_c8._16_8_ = (_Elt_pointer)0x0;
  local_110._0_4_ = 0;
  local_78._16_8_ = (_Base_ptr)0x0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_123[2] = 1;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_123[1] = 1;
  if ((_Elt_pointer)local_c8._32_8_ == (_Elt_pointer)0x0) {
    (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
              ((string *)local_98,local_120,(cmInstallCommandArguments *)local_78._24_8_);
  }
  else {
    (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
              ((string *)local_98,local_120,(cmInstallCommandArguments *)local_78._32_8_);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcVar8);
  psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_(pcVar8);
  psVar6 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(pcVar8);
  local_114 = cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
  local_123[0] = cmInstallCommandArguments::GetExcludeFromAll(pcVar8);
  cmMakefile::GetBacktrace((cmMakefile *)local_c8);
  std::
  make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((DependencyType *)local_100,(cmInstallRuntimeDependencySet **)&local_110,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&runtimeDependencySet_local,(bool *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_123 + 2),
             (bool *)(local_100 + 8),(char (*) [12])(local_123 + 1),(char (*) [13])"_CMAKE_DEPS",
             (char (*) [11])"_CMAKE_RPATH",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98,pbVar7,psVar4,(MessageLevel *)psVar6,(bool *)&local_114,
             (cmListFileBacktrace *)local_123);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(local_100 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  local_d0._M_head_impl = (cmInstallGenerator *)local_100;
  local_100 = (undefined1  [8])0x0;
  cmMakefile::AddInstallGenerator
            (local_120->Makefile,
             (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)&local_d0);
  if (local_d0._M_head_impl != (cmInstallGenerator *)0x0) {
    (**(code **)((((string *)
                  &((local_d0._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator)->
                 _M_dataplus)._M_p + 8))();
  }
  pcVar8 = local_108;
  local_d0._M_head_impl = (cmInstallGenerator *)0x0;
  if ((_Elt_pointer)local_c8._32_8_ == (_Elt_pointer)0x0) {
    installsRuntime = installsLibrary;
  }
  *installsRuntime = true;
  if (bVar2) {
    local_110._0_4_ = 1;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (_Elt_pointer)0x0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_123[2] = 1;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_123[1] = 1;
    psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_(local_108);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcVar8);
    psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_(pcVar8);
    __args_13 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(pcVar8);
    local_114 = cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
    local_123[0] = cmInstallCommandArguments::GetExcludeFromAll(local_108);
    cmMakefile::GetBacktrace((cmMakefile *)local_78);
    std::
    make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
              ((DependencyType *)local_c8,(cmInstallRuntimeDependencySet **)&local_110,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencySet_local,(bool *)local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_123 + 2),
               (bool *)(local_100 + 8),(char (*) [12])(local_123 + 1),(char (*) [13])"_CMAKE_DEPS",
               (char (*) [11])"_CMAKE_RPATH",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)psVar4,pbVar7,psVar6,(MessageLevel *)__args_13,(bool *)&local_114,
               (cmListFileBacktrace *)local_123);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    std::__cxx11::string::~string((string *)(local_100 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
    local_d8._M_head_impl = (cmInstallGenerator *)local_c8._0_8_;
    local_c8._0_8_ = (cmInstallGenerator *)0x0;
    cmMakefile::AddInstallGenerator
              (local_120->Makefile,
               (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)&local_d8
              );
    if (local_d8._M_head_impl != (cmInstallGenerator *)0x0) {
      (*(code *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((local_d8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator)->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)();
    }
    local_d8._M_head_impl = (cmInstallGenerator *)0x0;
    *installsFramework = true;
    if ((cmInstallGenerator *)local_c8._0_8_ != (cmInstallGenerator *)0x0) {
      (*(code *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((cmScriptGenerator *)local_c8._0_8_)->_vptr_cmScriptGenerator)->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)();
    }
  }
  if (local_100 != (undefined1  [8])0x0) {
    (**(code **)((((cmListFileContext *)local_100)->Name)._M_dataplus._M_p + 8))();
  }
  if ((_Elt_pointer)local_c8._24_8_ != (_Elt_pointer)0x0) {
    (*(code *)((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8._24_8_)->_M_impl).super__Vector_impl_data._M_start)->_M_string_length)
              ();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  return;
}

Assistant:

void AddInstallRuntimeDependenciesGenerator(
  Helper& helper, cmInstallRuntimeDependencySet* runtimeDependencySet,
  const cmInstallCommandArguments& runtimeArgs,
  const cmInstallCommandArguments& libraryArgs,
  const cmInstallCommandArguments& frameworkArgs,
  RuntimeDependenciesArgs runtimeDependenciesArgs, bool& installsRuntime,
  bool& installsLibrary, bool& installsFramework)
{
  bool dllPlatform =
    !helper.Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();
  bool apple =
    helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME") == "Darwin";
  auto const& runtimeDependenciesArgsRef =
    dllPlatform ? runtimeArgs : libraryArgs;
  std::vector<std::string> configurations =
    runtimeDependenciesArgsRef.GetConfigurations();
  if (apple) {
    std::copy(frameworkArgs.GetConfigurations().begin(),
              frameworkArgs.GetConfigurations().end(),
              std::back_inserter(configurations));
  }

  // Create file(GET_RUNTIME_DEPENDENCIES) generator.
  auto getRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallGetRuntimeDependenciesGenerator>(
      runtimeDependencySet, std::move(runtimeDependenciesArgs.Directories),
      std::move(runtimeDependenciesArgs.PreIncludeRegexes),
      std::move(runtimeDependenciesArgs.PreExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeRegexes),
      std::move(runtimeDependenciesArgs.PostExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeFiles),
      std::move(runtimeDependenciesArgs.PostExcludeFiles),
      runtimeDependenciesArgsRef.GetComponent(),
      apple ? frameworkArgs.GetComponent() : "", true, "_CMAKE_DEPS",
      "_CMAKE_RPATH", configurations,
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll() &&
        (apple ? frameworkArgs.GetExcludeFromAll() : true),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(getRuntimeDependenciesGenerator));

  // Create the library dependencies generator.
  auto libraryRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
      cmInstallRuntimeDependencySetGenerator::DependencyType::Library,
      runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
      true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
      dllPlatform ? helper.GetRuntimeDestination(&runtimeArgs)
                  : helper.GetLibraryDestination(&libraryArgs),
      runtimeDependenciesArgsRef.GetConfigurations(),
      runtimeDependenciesArgsRef.GetComponent(),
      runtimeDependenciesArgsRef.GetPermissions(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll(),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(libraryRuntimeDependenciesGenerator));
  if (dllPlatform) {
    installsRuntime = true;
  } else {
    installsLibrary = true;
  }

  if (apple) {
    // Create the framework dependencies generator.
    auto frameworkRuntimeDependenciesGenerator =
      cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
        cmInstallRuntimeDependencySetGenerator::DependencyType::Framework,
        runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
        true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
        frameworkArgs.GetDestination(), frameworkArgs.GetConfigurations(),
        frameworkArgs.GetComponent(), frameworkArgs.GetPermissions(),
        cmInstallGenerator::SelectMessageLevel(helper.Makefile),
        frameworkArgs.GetExcludeFromAll(), helper.Makefile->GetBacktrace());
    helper.Makefile->AddInstallGenerator(
      std::move(frameworkRuntimeDependenciesGenerator));
    installsFramework = true;
  }
}